

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O0

void __thiscall Nova::Arg_Data::Print_Synopsis(Arg_Data *this)

{
  ostream *poVar1;
  Arg_Data *this_local;
  
  if (this->type == OPTION) {
    poVar1 = std::operator<<(Log::(anonymous_namespace)::cerr,"[");
    poVar1 = std::operator<<(poVar1,(string *)&this->str);
    std::operator<<(poVar1,"]");
  }
  else {
    poVar1 = std::operator<<(Log::(anonymous_namespace)::cerr,"[");
    poVar1 = std::operator<<(poVar1,(string *)&this->str);
    poVar1 = std::operator<<(poVar1," <");
    poVar1 = std::operator<<(poVar1,(string *)&this->val_name);
    std::operator<<(poVar1,">]");
  }
  return;
}

Assistant:

void Print_Synopsis() const
    {
        if(type==OPTION) Log::cerr<<"["<<str<<"]";
        else Log::cerr<<"["<<str<<" <"<<val_name<<">]";
    }